

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall kratos::InlineGeneratorVisitor::visit(InlineGeneratorVisitor *this,Generator *top)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  pointer gen;
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  element_type *peVar5;
  GeneratorException *this_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  element_type *port_00;
  element_type *peVar7;
  PortInfo PVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  PortInfo res;
  shared_ptr<kratos::Port> *port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_128;
  pointer local_120;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *local_118;
  size_type local_110;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_108;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<kratos::Generator> *child;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  undefined1 local_78 [7];
  bool has_inlined_inst;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  inline_stmts;
  undefined1 local_30 [3];
  bool start_inline;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_generators;
  Generator *top_local;
  InlineGeneratorVisitor *this_local;
  
  child_generators.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)top;
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_30,top);
  bVar1 = std::
          vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::empty((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)local_30);
  if (!bVar1) {
    iVar3 = std::
            vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     *)local_30);
    iVar4 = std::
            vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)local_30);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Generator>*,std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>,kratos::InlineGeneratorVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&)_1_>
                      (iVar3._M_current,iVar4._M_current);
    if (bVar1) {
      std::
      vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
      ::vector((vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                *)local_78);
      bVar1 = false;
      __end2 = std::
               vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        *)local_30);
      child = (shared_ptr<kratos::Generator> *)
              std::
              vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     *)local_30);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                         *)&child), bVar2) {
        local_a0 = &__gnu_cxx::
                    __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                    ::operator*(&__end2)->
                    super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
        peVar5 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"inline",&local_c1);
        bVar2 = IRNode::has_attribute(&peVar5->super_IRNode,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          peVar5 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          bVar1 = Generator::is_cloned(peVar5);
          if (bVar1) {
LAB_003b2216:
            port_names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
            this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"Cannot inline cloned or external modules",&local_e9);
            local_128._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(local_a0);
            local_120 = child_generators.
                        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_118 = &local_128;
            local_110 = 2;
            this_00 = (allocator<kratos::IRNode_*> *)
                      ((long)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
            std::allocator<kratos::IRNode_*>::allocator(this_00);
            __l._M_len = local_110;
            __l._M_array = (iterator)local_118;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      (&local_108,__l,this_00);
            GeneratorException::GeneratorException(this_01,&local_e8,&local_108);
            port_names._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
            __cxa_throw(this_01,&GeneratorException::typeinfo,
                        GeneratorException::~GeneratorException);
          }
          peVar5 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          bVar1 = Generator::external(peVar5);
          if (bVar1) goto LAB_003b2216;
          bVar1 = true;
          peVar5 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          psVar6 = Generator::get_port_names_abi_cxx11_(peVar5);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3,psVar6);
          __end3 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range3);
          port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range3);
          while (bVar2 = std::operator!=(&__end3,(_Self *)&port_name), bVar2) {
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end3);
            peVar5 = std::
                     __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a0);
            Generator::get_port((Generator *)&res.stmt,(string *)peVar5);
            port_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&res.stmt
                                );
            PVar8 = get_port_assignment(port_00);
            res._0_8_ = PVar8.stmt;
            local_1a8._0_4_ = PVar8.direction;
            if ((AssignStmt *)res._0_8_ != (AssignStmt *)0x0) {
              std::
              vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
              ::emplace_back<kratos::InlineGeneratorVisitor::PortInfo&>
                        ((vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
                          *)local_78,(PortInfo *)local_1a8);
            }
            std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)&res.stmt);
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end3);
          }
          peVar5 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          gen = child_generators.
                super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          peVar7 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          std::operator+(&local_1c8,&peVar7->instance_name,"_");
          Generator::transfer_content(peVar5,(Generator *)gen,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          Generator::remove_child_generator
                    ((Generator *)
                     child_generators.
                     super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (shared_ptr<kratos::Generator> *)local_a0);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
        ::operator++(&__end2);
      }
      if (bVar1) {
        optimize_passthrough_assignment
                  ((Generator *)
                   child_generators.
                   super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                    *)local_78);
      }
      std::
      vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
      ::~vector((vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                 *)local_78);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_30);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto child_generators = top->get_child_generators();
        if (child_generators.empty()) return;
        // calculate if we should inline or not
        bool start_inline =
            std::all_of(child_generators.begin(), child_generators.end(),
                        [](auto const& gen) { return gen->get_child_generator_size() == 0; });
        if (!start_inline) return;

        std::vector<PortInfo> inline_stmts;
        bool has_inlined_inst = false;
        for (auto const& child : child_generators) {
            if (!child->has_attribute("inline")) {
                continue;
            }
            if (child->is_cloned() || child->external()) {
                throw GeneratorException("Cannot inline cloned or external modules",
                                         {child.get(), top});
            }
            has_inlined_inst = true;
            // figure out which port we should focus on
            auto port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto const& port = child->get_port(port_name);
                auto res = get_port_assignment(port.get());
                if (res.stmt) {
                    inline_stmts.emplace_back(res);
                }
            }

            child->transfer_content(*top, child->instance_name + "_");
            top->remove_child_generator(child);
        }
        if (has_inlined_inst) {
            optimize_passthrough_assignment(top, inline_stmts);
        }
    }